

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_4fPoint::Normalize(ON_4fPoint *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double s;
  double len;
  double c;
  double f [4];
  int i;
  bool rc;
  ON_4fPoint *this_local;
  
  f[3]._7_1_ = 0;
  f[3]._0_4_ = MaximumCoordinateIndex(this);
  dVar1 = std::fabs((double)(ulong)(uint)this->x);
  dVar2 = std::fabs((double)(ulong)(uint)this->y);
  f[0] = (double)SUB84(dVar2,0);
  dVar2 = std::fabs((double)(ulong)(uint)this->z);
  f[1] = (double)SUB84(dVar2,0);
  dVar3 = std::fabs((double)(ulong)(uint)this->w);
  f[2] = (double)SUB84(dVar3,0);
  dVar2 = f[(long)f[3]._0_4_ + -1];
  if (0.0 < dVar2) {
    dVar4 = 1.0 / dVar2;
    dVar1 = dVar4 * (double)SUB84(dVar1,0);
    f[0] = dVar4 * f[0];
    f[1] = dVar4 * f[1];
    f[2] = dVar4 * (double)SUB84(dVar3,0);
    f[(long)f[3]._0_4_ + -1] = 1.0;
    dVar1 = sqrt(f[2] * f[2] + f[1] * f[1] + dVar1 * dVar1 + f[0] * f[0]);
    dVar2 = 1.0 / (dVar2 * dVar1);
    this->x = (float)(dVar2 * (double)this->x);
    this->y = (float)(dVar2 * (double)this->y);
    this->z = (float)(dVar2 * (double)this->z);
    this->w = (float)(dVar2 * (double)this->w);
    f[3]._7_1_ = 1;
  }
  return (bool)(f[3]._7_1_ & 1);
}

Assistant:

bool ON_4fPoint::Normalize()
{
  bool rc = false;
  const int i = MaximumCoordinateIndex();
  double f[4];
  f[0] = fabs(x);
  f[1] = fabs(y);
  f[2] = fabs(z);
  f[3] = fabs(w);
  const double c = f[i];
  if ( c > 0.0 ) {
    double len = 1.0/c;
    f[0] *= len;
    f[1] *= len;
    f[2] *= len;
    f[3] *= len;
    f[i] = 1.0;
		// GBA 7/1/04.  Fixed typo
    const double s = 1.0/(c*sqrt(f[0]*f[0] + f[1]*f[1] + f[2]*f[2] + f[3]*f[3]));
    x = (float)(s*x);
    y = (float)(s*y);
    z = (float)(s*z);
    w = (float)(s*w);
    rc = true;
  }
  return rc;
}